

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

bool __thiscall cmGeneratorTarget::HasImplibGNUtoMS(cmGeneratorTarget *this,string *config)

{
  bool bVar1;
  allocator<char> local_31;
  string local_30;
  
  bVar1 = HasImportLibrary(this,config);
  if (bVar1) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"GNUtoMS",&local_31);
    bVar1 = GetPropertyAsBool(this,&local_30);
    std::__cxx11::string::~string((string *)&local_30);
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool cmGeneratorTarget::HasImplibGNUtoMS(std::string const& config) const
{
  return this->HasImportLibrary(config) && this->GetPropertyAsBool("GNUtoMS");
}